

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O3

IterateResult __thiscall gl3cts::ClipDistance::CoverageTest::iterate(CoverageTest *this)

{
  bool bVar1;
  int iVar2;
  ContextType ctxType;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  string local_40;
  Functions *gl;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x103);
  if (!bVar1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"GL_ARB_clip_distance is not supported","");
    tcu::NotSupportedError::NotSupportedError(this_00,&local_40);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  bVar1 = MaxClipDistancesValueTest(this,gl);
  if (bVar1) {
    bVar1 = EnableDisableTest(this,gl);
    if (bVar1) {
      bVar1 = MaxClipDistancesValueInVertexShaderTest(this,gl);
      if (bVar1) {
        bVar1 = MaxClipDistancesValueInFragmentShaderTest(this,gl);
        if (bVar1) {
          bVar1 = ClipDistancesValuePassing(this,gl);
          if (bVar1) {
            this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
            description = "Pass";
            testResult = QP_TEST_RESULT_PASS;
            goto LAB_00a6e8fc;
          }
        }
      }
    }
  }
  this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00a6e8fc:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl3cts::ClipDistance::CoverageTest::iterate()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* This test should only be executed if we're running a GL3.0 context */
	if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType(3, 0, glu::PROFILE_CORE)))
	{
		throw tcu::NotSupportedError("GL_ARB_clip_distance is not supported");
	}

	/* Running tests. */
	bool is_ok = true;

	is_ok = is_ok && MaxClipDistancesValueTest(gl);
	is_ok = is_ok && EnableDisableTest(gl);
	is_ok = is_ok && MaxClipDistancesValueInVertexShaderTest(gl);
	is_ok = is_ok && MaxClipDistancesValueInFragmentShaderTest(gl);
	is_ok = is_ok && ClipDistancesValuePassing(gl);

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}